

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_sse2.c
# Opt level: O0

void aom_highbd_filter_block1d4_v4_sse2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  short sVar13;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined8 *in_R9;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar19;
  undefined1 auVar18 [16];
  __m128i addFilterReg64;
  __m128i resReg34_56;
  __m128i resReg23_45;
  __m128i resReg34_56_lo;
  __m128i resReg23_45_lo;
  __m128i resReg56_lo;
  __m128i resReg45_lo;
  __m128i resReg34_lo;
  __m128i resReg23_lo;
  __m128i srcReg56_lo;
  __m128i srcReg45_lo;
  __m128i srcReg34_lo;
  __m128i srcReg23_lo;
  __m128i srcReg6;
  __m128i srcReg5;
  __m128i srcReg4;
  __m128i srcReg3;
  __m128i srcReg2;
  __m128i filtersReg;
  uint local_5fc;
  undefined8 local_5e8;
  undefined8 local_5c8;
  undefined8 local_5b8;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_4e8;
  undefined8 *local_488;
  long local_478;
  undefined4 uStack_42c;
  undefined4 uStack_420;
  undefined4 uStack_414;
  undefined4 uStack_410;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  undefined2 local_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 local_f8;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 local_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 local_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  __m128i tmp1;
  __m128i tmp0;
  __m128i max;
  ptrdiff_t dst_stride;
  ptrdiff_t src_stride;
  uint i;
  __m128i thirdFilters;
  __m128i secondFilters;
  
  sVar13 = (short)(1 << ((byte)addFilterReg64[1] & 0x1f)) + -1;
  uVar1 = in_R9[1];
  uVar19 = (undefined4)((ulong)*in_R9 >> 0x20);
  uStack_420 = (undefined4)uVar1;
  uStack_42c = (undefined4)((ulong)uVar1 >> 0x20);
  auVar3._4_8_ = uVar1;
  auVar3._0_4_ = uVar19;
  auVar14._0_8_ = auVar3._0_8_ << 0x20;
  auVar14._8_4_ = uStack_420;
  auVar14._12_4_ = uStack_42c;
  uStack_414 = (undefined4)*in_R9;
  auVar4._4_8_ = auVar14._8_8_;
  auVar4._0_4_ = uStack_414;
  auVar18._0_8_ = auVar4._0_8_ << 0x20;
  auVar18._8_4_ = uStack_410;
  auVar18._12_4_ = uVar19;
  uVar5 = CONCAT44(uStack_420,uStack_420);
  uVar1 = *(undefined8 *)(in_RDI + in_RSI * 4);
  uVar2 = *(undefined8 *)(in_RDI + in_RSI * 6);
  uStack_a6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_a4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_a2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_b8 = (undefined2)uVar2;
  uStack_b6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_b4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_b2 = (undefined2)((ulong)uVar2 >> 0x30);
  local_518 = CONCAT26(uStack_b6,CONCAT24(uStack_a6,CONCAT22(local_b8,(short)uVar1)));
  uStack_510 = CONCAT26(uStack_b2,CONCAT24(uStack_a2,CONCAT22(uStack_b4,uStack_a4)));
  local_4e8 = *(undefined8 *)(in_RDI + in_RSI * 8);
  local_d8 = (undefined2)local_4e8;
  uStack_d6 = (undefined2)((ulong)local_4e8 >> 0x10);
  uStack_d4 = (undefined2)((ulong)local_4e8 >> 0x20);
  uStack_d2 = (undefined2)((ulong)local_4e8 >> 0x30);
  local_528 = CONCAT26(uStack_d6,CONCAT24(uStack_b6,CONCAT22(local_d8,local_b8)));
  uStack_520 = CONCAT26(uStack_d2,CONCAT24(uStack_b2,CONCAT22(uStack_d4,uStack_b4)));
  local_488 = in_RDX;
  local_478 = in_RDI;
  for (local_5fc = in_R8D; 1 < local_5fc; local_5fc = local_5fc - 2) {
    uVar1 = *(undefined8 *)(local_478 + in_RSI * 10);
    local_e8 = (undefined2)local_4e8;
    uStack_e6 = (undefined2)((ulong)local_4e8 >> 0x10);
    uStack_e4 = (undefined2)((ulong)local_4e8 >> 0x20);
    uStack_e2 = (undefined2)((ulong)local_4e8 >> 0x30);
    local_f8 = (undefined2)uVar1;
    uStack_f6 = (undefined2)((ulong)uVar1 >> 0x10);
    uStack_f4 = (undefined2)((ulong)uVar1 >> 0x20);
    uStack_f2 = (undefined2)((ulong)uVar1 >> 0x30);
    local_4e8 = *(undefined8 *)(local_478 + in_RSI * 0xc);
    local_118 = (undefined2)local_4e8;
    uStack_116 = (undefined2)((ulong)local_4e8 >> 0x10);
    uStack_114 = (undefined2)((ulong)local_4e8 >> 0x20);
    uStack_112 = (undefined2)((ulong)local_4e8 >> 0x30);
    auVar10._8_8_ = uStack_510;
    auVar10._0_8_ = local_518;
    auVar9._8_8_ = auVar18._8_8_;
    auVar9._0_8_ = local_5e8;
    auVar14 = pmaddwd(auVar10,auVar9);
    auVar8._8_8_ = uStack_520;
    auVar8._0_8_ = local_528;
    auVar15._8_8_ = auVar18._8_8_;
    auVar15._0_8_ = local_5e8;
    auVar15 = pmaddwd(auVar8,auVar15);
    auVar7._2_2_ = local_f8;
    auVar7._0_2_ = local_e8;
    auVar7._4_2_ = uStack_e6;
    auVar7._6_2_ = uStack_f6;
    auVar7._10_2_ = uStack_f4;
    auVar7._8_2_ = uStack_e4;
    auVar7._12_2_ = uStack_e2;
    auVar7._14_2_ = uStack_f2;
    auVar16._8_8_ = uVar5;
    auVar16._0_8_ = uVar5;
    auVar16 = pmaddwd(auVar7,auVar16);
    auVar6._2_2_ = local_118;
    auVar6._0_2_ = local_f8;
    auVar6._4_2_ = uStack_f6;
    auVar6._6_2_ = uStack_116;
    auVar6._10_2_ = uStack_114;
    auVar6._8_2_ = uStack_f4;
    auVar6._12_2_ = uStack_f2;
    auVar6._14_2_ = uStack_112;
    auVar17._8_8_ = uVar5;
    auVar17._0_8_ = uVar5;
    auVar17 = pmaddwd(auVar6,auVar17);
    local_2e8 = auVar14._0_4_;
    iStack_2e4 = auVar14._4_4_;
    iStack_2e0 = auVar14._8_4_;
    iStack_2dc = auVar14._12_4_;
    local_2f8 = auVar16._0_4_;
    iStack_2f4 = auVar16._4_4_;
    iStack_2f0 = auVar16._8_4_;
    iStack_2ec = auVar16._12_4_;
    local_308 = auVar15._0_4_;
    iStack_304 = auVar15._4_4_;
    iStack_300 = auVar15._8_4_;
    iStack_2fc = auVar15._12_4_;
    local_318 = auVar17._0_4_;
    iStack_314 = auVar17._4_4_;
    iStack_310 = auVar17._8_4_;
    iStack_30c = auVar17._12_4_;
    auVar14 = ZEXT416(7);
    auVar17 = ZEXT416(7);
    auVar12._4_4_ = iStack_2e4 + iStack_2f4 + 0x40 >> auVar14;
    auVar12._0_4_ = local_2e8 + local_2f8 + 0x40 >> auVar14;
    auVar12._12_4_ = iStack_2dc + iStack_2ec + 0x40 >> auVar14;
    auVar12._8_4_ = iStack_2e0 + iStack_2f0 + 0x40 >> auVar14;
    auVar14 = packssdw(auVar12,ZEXT816(0));
    auVar11._4_4_ = iStack_304 + iStack_314 + 0x40 >> auVar17;
    auVar11._0_4_ = local_308 + local_318 + 0x40 >> auVar17;
    auVar11._12_4_ = iStack_2fc + iStack_30c + 0x40 >> auVar17;
    auVar11._8_4_ = iStack_300 + iStack_310 + 0x40 >> auVar17;
    auVar17 = packssdw(auVar11,ZEXT816(0));
    local_228 = auVar14._0_2_;
    sStack_226 = auVar14._2_2_;
    sStack_224 = auVar14._4_2_;
    sStack_222 = auVar14._6_2_;
    local_228 = (ushort)(-1 < local_228) * local_228;
    sStack_226 = (ushort)(-1 < sStack_226) * sStack_226;
    sStack_224 = (ushort)(-1 < sStack_224) * sStack_224;
    sStack_222 = (ushort)(-1 < sStack_222) * sStack_222;
    local_5b8 = CONCAT26((ushort)(sVar13 < sStack_222) * sVar13 |
                         (ushort)(sVar13 >= sStack_222) * sStack_222,
                         CONCAT24((ushort)(sVar13 < sStack_224) * sVar13 |
                                  (ushort)(sVar13 >= sStack_224) * sStack_224,
                                  CONCAT22((ushort)(sVar13 < sStack_226) * sVar13 |
                                           (ushort)(sVar13 >= sStack_226) * sStack_226,
                                           (ushort)(sVar13 < local_228) * sVar13 |
                                           (ushort)(sVar13 >= local_228) * local_228)));
    local_248 = auVar17._0_2_;
    sStack_246 = auVar17._2_2_;
    sStack_244 = auVar17._4_2_;
    sStack_242 = auVar17._6_2_;
    local_248 = (ushort)(-1 < local_248) * local_248;
    sStack_246 = (ushort)(-1 < sStack_246) * sStack_246;
    sStack_244 = (ushort)(-1 < sStack_244) * sStack_244;
    sStack_242 = (ushort)(-1 < sStack_242) * sStack_242;
    local_5c8 = CONCAT26((ushort)(sVar13 < sStack_242) * sVar13 |
                         (ushort)(sVar13 >= sStack_242) * sStack_242,
                         CONCAT24((ushort)(sVar13 < sStack_244) * sVar13 |
                                  (ushort)(sVar13 >= sStack_244) * sStack_244,
                                  CONCAT22((ushort)(sVar13 < sStack_246) * sVar13 |
                                           (ushort)(sVar13 >= sStack_246) * sStack_246,
                                           (ushort)(sVar13 < local_248) * sVar13 |
                                           (ushort)(sVar13 >= local_248) * local_248)));
    local_478 = local_478 + in_RSI * 4;
    *local_488 = local_5b8;
    *(undefined8 *)((long)local_488 + in_RCX * 2) = local_5c8;
    local_488 = (undefined8 *)(in_RCX * 4 + (long)local_488);
    local_518 = CONCAT26(uStack_f6,CONCAT24(uStack_e6,CONCAT22(local_f8,local_e8)));
    uStack_510 = CONCAT26(uStack_f2,CONCAT24(uStack_e2,CONCAT22(uStack_f4,uStack_e4)));
    local_528 = CONCAT26(uStack_116,CONCAT24(uStack_f6,CONCAT22(local_118,local_f8)));
    uStack_520 = CONCAT26(uStack_112,CONCAT24(uStack_f2,CONCAT22(uStack_114,uStack_f4)));
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d4_v4_sse2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  __m128i filtersReg;
  __m128i srcReg2, srcReg3, srcReg4, srcReg5, srcReg6;
  __m128i srcReg23_lo, srcReg34_lo;
  __m128i srcReg45_lo, srcReg56_lo;
  __m128i resReg23_lo, resReg34_lo, resReg45_lo, resReg56_lo;
  __m128i resReg23_45_lo, resReg34_56_lo;
  __m128i resReg23_45, resReg34_56;
  __m128i addFilterReg64, secondFilters, thirdFilters;
  unsigned int i;
  ptrdiff_t src_stride, dst_stride;

  const __m128i max = _mm_set1_epi16((1 << bd) - 1);
  addFilterReg64 = _mm_set1_epi32(64);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);

  // coeffs 0 1 0 1 2 3 2 3
  const __m128i tmp0 = _mm_unpacklo_epi32(filtersReg, filtersReg);
  // coeffs 4 5 4 5 6 7 6 7
  const __m128i tmp1 = _mm_unpackhi_epi32(filtersReg, filtersReg);

  secondFilters = _mm_unpackhi_epi64(tmp0, tmp0);  // coeffs 2 3 2 3 2 3 2 3
  thirdFilters = _mm_unpacklo_epi64(tmp1, tmp1);   // coeffs 4 5 4 5 4 5 4 5

  // multiply the size of the source and destination stride by two
  src_stride = src_pitch << 1;
  dst_stride = dst_pitch << 1;

  srcReg2 = _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 2));
  srcReg3 = _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 3));
  srcReg23_lo = _mm_unpacklo_epi16(srcReg2, srcReg3);

  srcReg4 = _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 4));
  srcReg34_lo = _mm_unpacklo_epi16(srcReg3, srcReg4);

  for (i = height; i > 1; i -= 2) {
    srcReg5 = _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 5));
    srcReg45_lo = _mm_unpacklo_epi16(srcReg4, srcReg5);

    srcReg6 = _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 6));
    srcReg56_lo = _mm_unpacklo_epi16(srcReg5, srcReg6);

    // multiply 2 adjacent elements with the filter and add the result

    resReg23_lo = _mm_madd_epi16(srcReg23_lo, secondFilters);
    resReg34_lo = _mm_madd_epi16(srcReg34_lo, secondFilters);
    resReg45_lo = _mm_madd_epi16(srcReg45_lo, thirdFilters);
    resReg56_lo = _mm_madd_epi16(srcReg56_lo, thirdFilters);

    resReg23_45_lo = _mm_add_epi32(resReg23_lo, resReg45_lo);
    resReg34_56_lo = _mm_add_epi32(resReg34_lo, resReg56_lo);

    // shift by 7 bit each 32 bit
    resReg23_45_lo = _mm_add_epi32(resReg23_45_lo, addFilterReg64);
    resReg34_56_lo = _mm_add_epi32(resReg34_56_lo, addFilterReg64);
    resReg23_45_lo = _mm_srai_epi32(resReg23_45_lo, 7);
    resReg34_56_lo = _mm_srai_epi32(resReg34_56_lo, 7);

    // shrink to 16 bit each 32 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve
    // result
    resReg23_45 = _mm_packs_epi32(resReg23_45_lo, _mm_setzero_si128());
    resReg34_56 = _mm_packs_epi32(resReg34_56_lo, _mm_setzero_si128());

    resReg23_45 = _mm_max_epi16(resReg23_45, _mm_setzero_si128());
    resReg23_45 = _mm_min_epi16(resReg23_45, max);
    resReg34_56 = _mm_max_epi16(resReg34_56, _mm_setzero_si128());
    resReg34_56 = _mm_min_epi16(resReg34_56, max);

    src_ptr += src_stride;

    _mm_storel_epi64((__m128i *)dst_ptr, (resReg23_45));
    _mm_storel_epi64((__m128i *)(dst_ptr + dst_pitch), (resReg34_56));

    dst_ptr += dst_stride;

    // save part of the registers for next strides
    srcReg23_lo = srcReg45_lo;
    srcReg34_lo = srcReg56_lo;
    srcReg4 = srcReg6;
  }
}